

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQUserPointer sq_newuserdata(HSQUIRRELVM v,SQUnsignedInteger size)

{
  SQUnsignedInteger *pSVar1;
  SQObjectValue SVar2;
  SQObjectPtr local_20;
  
  SVar2.pUserData = SQUserData::Create(v->_sharedstate,size + 8);
  local_20.super_SQObject._type = OT_USERDATA;
  pSVar1 = &((SVar2.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_20.super_SQObject._unVal.pUserData = SVar2.pUserData;
  SQVM::Push(v,&local_20);
  SQObjectPtr::~SQObjectPtr(&local_20);
  return (SQUserPointer)((ulong)((long)&(SVar2.pTable)->_usednodes + 7U) & 0xfffffffffffffff8);
}

Assistant:

SQUserPointer sq_newuserdata(HSQUIRRELVM v,SQUnsignedInteger size)
{
    SQUserData *ud = SQUserData::Create(_ss(v), size + SQ_ALIGNMENT);
    v->Push(ud);
    return (SQUserPointer)sq_aligning(ud + 1);
}